

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<tcu::Format::HexIterator<unsigned_int,_const_unsigned_int_*>_> *fmt)

{
  Hex<8UL> hex;
  uint *puVar1;
  
  std::operator<<(str,"{ ");
  for (puVar1 = (fmt->begin).m_iter; puVar1 != (fmt->end).m_iter; puVar1 = puVar1 + 1) {
    if (puVar1 != (fmt->begin).m_iter) {
      std::operator<<(str,", ");
    }
    hex.value._4_4_ = 0;
    hex.value._0_4_ = *puVar1;
    operator<<(str,hex);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}